

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O2

void __thiscall Inferences::Instantiation::registerClause(Instantiation *this,Clause *cl)

{
  Term *this_00;
  bool bVar1;
  TermList TVar2;
  Set<Kernel::Term_*,_Lib::DefaultHash> *this_01;
  Literal **ppLVar3;
  TermList *result;
  uint uVar4;
  Set<Kernel::Term_*,_Lib::DefaultHash> *cans_check;
  TermList sort;
  Stack<Kernel::Term_*> *cans;
  uint local_74;
  DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_70;
  Literal **local_68;
  Instantiation *local_60;
  SubtermIterator it;
  
  local_68 = cl->_literals;
  local_74 = *(uint *)&cl->field_0x38 & 0xfffff;
  local_70 = &this->sorted_candidates_check;
  ppLVar3 = (Literal **)0x0;
  if (local_74 != 0) {
    ppLVar3 = local_68;
  }
  uVar4 = (uint)(local_74 != 0);
  local_60 = this;
  do {
    if (ppLVar3 == (Literal **)0x0) {
      return;
    }
    Kernel::SubtermIterator::SubtermIterator(&it,&(*ppLVar3)->super_Term);
    while( true ) {
      bVar1 = Kernel::SubtermIterator::hasNext(&it);
      if (!bVar1) break;
      it._used = true;
      this_00 = (Term *)**(undefined8 **)
                          (*(long *)((long)it._stack._self._M_t.
                                           super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                                           .
                                           super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>
                                           ._M_head_impl + 0x10) + -8);
      if (((ulong)this_00 & 3) == 0) {
        bVar1 = Kernel::Term::ground(this_00);
        if (bVar1) {
          sort._content = 2;
          bVar1 = Kernel::SortHelper::tryGetResultSort((SortHelper *)this_00,(TermList)&sort,result)
          ;
          if (bVar1) {
            TVar2 = Kernel::AtomicSort::defaultSort();
            if (sort._content != TVar2._content) {
              cans_check = (Set<Kernel::Term_*,_Lib::DefaultHash> *)0x0;
              cans = (Stack<Kernel::Term_*> *)0x0;
              if ((local_60->sorted_candidates)._size == 0) {
LAB_004052b7:
                this_01 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                          Lib::Set<Kernel::Term*,Lib::DefaultHash>::operator_new(0x28);
                Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Set(this_01);
                cans_check = this_01;
                cans = (Stack<Kernel::Term_*> *)Lib::Stack<Kernel::Term*>::operator_new(0x20);
                cans->_cursor = (Term **)0x0;
                cans->_end = (Term **)0x0;
                cans->_capacity = 0;
                cans->_stack = (Term **)0x0;
                Lib::
                DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&this->sorted_candidates,sort,cans);
                Lib::
                DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(local_70,sort,cans_check);
              }
              else {
                bVar1 = Lib::
                        DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                        ::find(&this->sorted_candidates,&sort,&cans);
                if (!bVar1) goto LAB_004052b7;
                Lib::
                DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::find(local_70,&sort,&cans_check);
              }
              bVar1 = Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::contains(cans_check,this_00);
              if (!bVar1) {
                Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::insert(cans_check,this_00);
                Lib::Stack<Kernel::Term_*>::push(cans,this_00);
              }
            }
          }
        }
      }
    }
    Kernel::SubtermIterator::~SubtermIterator(&it);
    ppLVar3 = local_68 + (int)uVar4;
    if (local_74 <= uVar4) {
      ppLVar3 = (Literal **)0x0;
    }
    uVar4 = uVar4 + (uVar4 < local_74);
  } while( true );
}

Assistant:

void Instantiation::registerClause(Clause* cl)
{
  ASS(cl);

  //cout << "register " << cl->toString() << endl;

  for (Literal* lit : cl->iterLits()) {
    SubtermIterator it(lit);
    while(it.hasNext()){
      TermList t = it.next();
      if(t.isTerm() && t.term()->ground()){
        TermList sort;
        if(SortHelper::tryGetResultSort(t,sort)){
          if(sort==AtomicSort::defaultSort()) continue;
          Set<Term*>* cans_check=0;
          Stack<Term*>* cans=0;
          if(sorted_candidates.isEmpty() || !sorted_candidates.find(sort,cans)){
            cans_check = new Set<Term*>();
            cans = new Stack<Term*>();
            sorted_candidates.insert(sort,cans);
            sorted_candidates_check.insert(sort,cans_check);
          }
          else{ ALWAYS(sorted_candidates_check.find(sort,cans_check)); }
          ASS(cans_check && cans);
          // cout << "For sort " << sort << " there are " << cans->size() << " cans" <<endl;
          if(!cans_check->contains(t.term())){
            cans_check->insert(t.term());
            cans->push(t.term());
          }
        }
      }
    }
  }

}